

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::BuildEnum
          (DescriptorBuilder *this,EnumDescriptorProto *proto,Descriptor *parent,
          EnumDescriptor *result)

{
  uint count;
  void *pvVar1;
  Rep *pRVar2;
  void *pvVar3;
  Message *pMVar4;
  key_type *__k;
  ReservedRange *pRVar5;
  Symbol symbol;
  Descriptor *pDVar6;
  string *psVar7;
  string *psVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar9;
  iterator iVar10;
  int j;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  undefined1 *orig_options;
  EnumValueDescriptor *pEVar15;
  int i;
  long lVar16;
  ulong uVar17;
  SubstituteArg local_278;
  SubstituteArg local_248;
  SubstituteArg local_218;
  SubstituteArg local_1e8;
  SubstituteArg local_1b8;
  SubstituteArg local_188;
  SubstituteArg local_158;
  SubstituteArg local_128;
  SubstituteArg local_f8;
  undefined4 local_c8;
  undefined4 uStack_c4;
  EnumDescriptor *pEStack_c0;
  SubstituteArg local_b8;
  string local_88;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reserved_name_set;
  
  pDVar6 = parent;
  if (parent == (Descriptor *)0x0) {
    pDVar6 = (Descriptor *)this->file_;
  }
  psVar7 = AllocateNameString(this,*(string **)(pDVar6 + 8),(proto->name_).ptr_);
  ValidateSymbolName(this,(proto->name_).ptr_,psVar7,&proto->super_Message);
  psVar8 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->name_).ptr_);
  *(string **)result = psVar8;
  *(string **)(result + 8) = psVar7;
  *(FileDescriptor **)(result + 0x10) = this->file_;
  *(Descriptor **)(result + 0x18) = parent;
  *(undefined2 *)(result + 0x28) = 0;
  iVar14 = (proto->value_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar14 == 0) {
    AddError(this,psVar7,&proto->super_Message,NAME,"Enums must contain at least one value.");
    iVar14 = (proto->value_).super_RepeatedPtrFieldBase.current_size_;
  }
  *(int *)(result + 0x2c) = iVar14;
  AllocateArray<google::protobuf::EnumValueDescriptor>
            (this,iVar14,(EnumValueDescriptor **)(result + 0x30));
  lVar11 = 0;
  for (lVar16 = 0; lVar16 < (proto->value_).super_RepeatedPtrFieldBase.current_size_;
      lVar16 = lVar16 + 1) {
    BuildEnumValue(this,(EnumValueDescriptorProto *)
                        ((proto->value_).super_RepeatedPtrFieldBase.rep_)->elements[lVar16],result,
                   (EnumValueDescriptor *)(*(long *)(result + 0x30) + lVar11));
    lVar11 = lVar11 + 0x28;
  }
  iVar14 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x38) = iVar14;
  AllocateArray<google::protobuf::EnumDescriptor::ReservedRange>
            (this,iVar14,(ReservedRange **)(result + 0x40));
  lVar11 = 0;
  for (lVar16 = 0; lVar16 < (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
      lVar16 = lVar16 + 1) {
    BuildReservedRange(this,*(EnumReservedRange **)
                             ((long)((proto->reserved_range_).super_RepeatedPtrFieldBase.rep_)->
                                    elements + lVar11),result,
                       (ReservedRange *)(*(long *)(result + 0x40) + lVar11));
    lVar11 = lVar11 + 8;
  }
  count = (proto->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  *(uint *)(result + 0x3c) = count;
  ppbVar9 = DescriptorPool::Tables::AllocateArray<std::__cxx11::string_const*>(this->tables_,count);
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ***)(result + 0x48) = ppbVar9;
  uVar12 = 0;
  uVar17 = (ulong)count;
  if ((int)count < 1) {
    uVar17 = uVar12;
  }
  for (; uVar17 != uVar12; uVar12 = uVar12 + 1) {
    psVar7 = DescriptorPool::Tables::AllocateString
                       (this->tables_,
                        (string *)
                        ((proto->reserved_name_).super_RepeatedPtrFieldBase.rep_)->elements[uVar12])
    ;
    *(string **)(*(long *)(result + 0x48) + uVar12 * 8) = psVar7;
  }
  CheckEnumValueUniqueness(this,proto,result);
  if (((proto->_has_bits_).has_bits_[0] & 2) == 0) {
    *(undefined8 *)(result + 0x20) = 0;
  }
  else {
    orig_options = (undefined1 *)proto->options_;
    if ((EnumOptions *)orig_options == (EnumOptions *)0x0) {
      orig_options = _EnumOptions_default_instance_;
    }
    AllocateOptions<google::protobuf::EnumDescriptor>(this,(OptionsType *)orig_options,result,3);
  }
  local_c8 = 4;
  symbol._4_4_ = uStack_c4;
  symbol.type = 4;
  symbol.field_1.enum_descriptor = result;
  pEStack_c0 = result;
  AddSymbol(this,*(string **)(result + 8),parent,*(string **)result,&proto->super_Message,symbol);
  iVar14 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  lVar11 = 2;
  lVar16 = 0;
  while (lVar16 < iVar14) {
    pvVar1 = ((proto->reserved_range_).super_RepeatedPtrFieldBase.rep_)->elements[lVar16];
    for (lVar13 = lVar11; (int)lVar13 + -1 < iVar14; lVar13 = lVar13 + 1) {
      pRVar2 = (proto->reserved_range_).super_RepeatedPtrFieldBase.rep_;
      pvVar3 = pRVar2->elements[lVar13 + -1];
      if ((*(int *)((long)pvVar3 + 0x18) <= *(int *)((long)pvVar1 + 0x1c)) &&
         (*(int *)((long)pvVar1 + 0x18) <= *(int *)((long)pvVar3 + 0x1c))) {
        psVar7 = *(string **)(result + 8);
        pMVar4 = (Message *)pRVar2->elements[lVar16];
        strings::internal::SubstituteArg::SubstituteArg
                  ((SubstituteArg *)&reserved_name_set,*(int *)((long)pvVar3 + 0x18));
        strings::internal::SubstituteArg::SubstituteArg(&local_f8,*(int *)((long)pvVar3 + 0x1c));
        strings::internal::SubstituteArg::SubstituteArg(&local_b8,*(int *)((long)pvVar1 + 0x18));
        strings::internal::SubstituteArg::SubstituteArg(&local_128,*(int *)((long)pvVar1 + 0x1c));
        local_188.text_ = (char *)0x0;
        local_188.size_ = -1;
        local_1b8.text_ = (char *)0x0;
        local_1b8.size_ = -1;
        local_1e8.text_ = (char *)0x0;
        local_1e8.size_ = -1;
        local_218.text_ = (char *)0x0;
        local_218.size_ = -1;
        local_248.text_ = (char *)0x0;
        local_248.size_ = -1;
        local_278.text_ = (char *)0x0;
        local_278.size_ = -1;
        strings::Substitute_abi_cxx11_
                  ((string *)&local_158,
                   (strings *)
                   "Reserved range $0 to $1 overlaps with already-defined range $2 to $3.",
                   (char *)&reserved_name_set,&local_f8,&local_b8,&local_128,&local_188,&local_1b8,
                   &local_1e8,&local_218,&local_248,&local_278,(SubstituteArg *)proto);
        AddError(this,psVar7,pMVar4,NUMBER,(string *)&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        iVar14 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
      }
    }
    lVar11 = lVar11 + 1;
    lVar16 = lVar16 + 1;
  }
  reserved_name_set._M_h._M_buckets = &reserved_name_set._M_h._M_single_bucket;
  reserved_name_set._M_h._M_bucket_count = 1;
  reserved_name_set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  reserved_name_set._M_h._M_element_count = 0;
  reserved_name_set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  reserved_name_set._M_h._M_rehash_policy._M_next_resize = 0;
  reserved_name_set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  for (lVar11 = 0; lVar11 < (proto->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
      lVar11 = lVar11 + 1) {
    __k = (key_type *)((proto->reserved_name_).super_RepeatedPtrFieldBase.rep_)->elements[lVar11];
    iVar10 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::find(&reserved_name_set._M_h,__k);
    if (iVar10.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::__detail::
      _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&reserved_name_set._M_h,__k);
    }
    else {
      local_f8.text_ = (__k->_M_dataplus)._M_p;
      local_f8.size_ = (int)__k->_M_string_length;
      local_b8.text_ = (char *)0x0;
      local_b8.size_ = -1;
      local_128.text_ = (char *)0x0;
      local_128.size_ = -1;
      local_188.text_ = (char *)0x0;
      local_188.size_ = -1;
      local_1b8.text_ = (char *)0x0;
      local_1b8.size_ = -1;
      local_1e8.text_ = (char *)0x0;
      local_1e8.size_ = -1;
      local_218.text_ = (char *)0x0;
      local_218.size_ = -1;
      local_248.text_ = (char *)0x0;
      local_248.size_ = -1;
      local_278.text_ = (char *)0x0;
      local_278.size_ = -1;
      local_158.text_ = (char *)0x0;
      local_158.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_88,(strings *)"Enum value \"$0\" is reserved multiple times.",
                 (char *)&local_f8,&local_b8,&local_128,&local_188,&local_1b8,&local_1e8,&local_218,
                 &local_248,&local_278,&local_158,(SubstituteArg *)proto);
      AddError(this,__k,&proto->super_Message,NAME,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  for (lVar11 = 0; lVar11 < *(int *)(result + 0x2c); lVar11 = lVar11 + 1) {
    pEVar15 = *(EnumValueDescriptor **)(result + 0x30) + lVar11 * 0x28;
    for (lVar16 = 0; lVar16 < *(int *)(result + 0x38); lVar16 = lVar16 + 1) {
      pRVar5 = *(ReservedRange **)(result + 0x40);
      iVar14 = *(int *)(pEVar15 + 0x10);
      if ((pRVar5[lVar16].start <= iVar14) && (iVar14 <= pRVar5[lVar16].end)) {
        psVar7 = *(string **)(pEVar15 + 8);
        pMVar4 = (Message *)
                 ((proto->reserved_range_).super_RepeatedPtrFieldBase.rep_)->elements[lVar16];
        local_f8.text_ = (char *)**(undefined8 **)pEVar15;
        local_f8.size_ = *(int *)(*(undefined8 **)pEVar15 + 1);
        strings::internal::SubstituteArg::SubstituteArg(&local_b8,iVar14);
        local_128.text_ = (char *)0x0;
        local_128.size_ = -1;
        local_188.text_ = (char *)0x0;
        local_188.size_ = -1;
        local_1b8.text_ = (char *)0x0;
        local_1b8.size_ = -1;
        local_1e8.text_ = (char *)0x0;
        local_1e8.size_ = -1;
        local_218.text_ = (char *)0x0;
        local_218.size_ = -1;
        local_248.text_ = (char *)0x0;
        local_248.size_ = -1;
        local_278.text_ = (char *)0x0;
        local_278.size_ = -1;
        local_158.text_ = (char *)0x0;
        local_158.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_88,(strings *)"Enum value \"$0\" uses reserved number $1.",
                   (char *)&local_f8,&local_b8,&local_128,&local_188,&local_1b8,&local_1e8,
                   &local_218,&local_248,&local_278,&local_158,(SubstituteArg *)proto);
        AddError(this,psVar7,pMVar4,NUMBER,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
    }
    iVar10 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::find(&reserved_name_set._M_h,*(key_type **)pEVar15);
    if (iVar10.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      psVar7 = *(string **)(pEVar15 + 8);
      pMVar4 = (Message *)((proto->value_).super_RepeatedPtrFieldBase.rep_)->elements[lVar11];
      local_f8.text_ = (char *)**(undefined8 **)pEVar15;
      local_f8.size_ = *(int *)(*(undefined8 **)pEVar15 + 1);
      local_b8.text_ = (char *)0x0;
      local_b8.size_ = -1;
      local_128.text_ = (char *)0x0;
      local_128.size_ = -1;
      local_188.text_ = (char *)0x0;
      local_188.size_ = -1;
      local_1b8.text_ = (char *)0x0;
      local_1b8.size_ = -1;
      local_1e8.text_ = (char *)0x0;
      local_1e8.size_ = -1;
      local_218.text_ = (char *)0x0;
      local_218.size_ = -1;
      local_248.text_ = (char *)0x0;
      local_248.size_ = -1;
      local_278.text_ = (char *)0x0;
      local_278.size_ = -1;
      local_158.text_ = (char *)0x0;
      local_158.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_88,(strings *)"Enum value \"$0\" is reserved.",(char *)&local_f8,&local_b8,
                 &local_128,&local_188,&local_1b8,&local_1e8,&local_218,&local_248,&local_278,
                 &local_158,(SubstituteArg *)proto);
      AddError(this,psVar7,pMVar4,NAME,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&reserved_name_set._M_h);
  return;
}

Assistant:

void DescriptorBuilder::BuildEnum(const EnumDescriptorProto& proto,
                                  const Descriptor* parent,
                                  EnumDescriptor* result) {
  const std::string& scope =
      (parent == nullptr) ? file_->package() : parent->full_name();
  std::string* full_name = AllocateNameString(scope, proto.name());
  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_ = tables_->AllocateString(proto.name());
  result->full_name_ = full_name;
  result->file_ = file_;
  result->containing_type_ = parent;
  result->is_placeholder_ = false;
  result->is_unqualified_placeholder_ = false;

  if (proto.value_size() == 0) {
    // We cannot allow enums with no values because this would mean there
    // would be no valid default value for fields of this type.
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
             "Enums must contain at least one value.");
  }

  BUILD_ARRAY(proto, result, value, BuildEnumValue, result);
  BUILD_ARRAY(proto, result, reserved_range, BuildReservedRange, result);

  // Copy reserved names.
  int reserved_name_count = proto.reserved_name_size();
  result->reserved_name_count_ = reserved_name_count;
  result->reserved_names_ =
      tables_->AllocateArray<const std::string*>(reserved_name_count);
  for (int i = 0; i < reserved_name_count; ++i) {
    result->reserved_names_[i] =
        tables_->AllocateString(proto.reserved_name(i));
  }

  CheckEnumValueUniqueness(proto, result);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = nullptr;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result,
                    EnumDescriptorProto::kOptionsFieldNumber);
  }

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));

  for (int i = 0; i < proto.reserved_range_size(); i++) {
    const EnumDescriptorProto_EnumReservedRange& range1 =
        proto.reserved_range(i);
    for (int j = i + 1; j < proto.reserved_range_size(); j++) {
      const EnumDescriptorProto_EnumReservedRange& range2 =
          proto.reserved_range(j);
      if (range1.end() >= range2.start() && range2.end() >= range1.start()) {
        AddError(result->full_name(), proto.reserved_range(i),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute("Reserved range $0 to $1 overlaps with "
                                     "already-defined range $2 to $3.",
                                     range2.start(), range2.end(),
                                     range1.start(), range1.end()));
      }
    }
  }

  HASH_SET<std::string> reserved_name_set;
  for (int i = 0; i < proto.reserved_name_size(); i++) {
    const std::string& name = proto.reserved_name(i);
    if (reserved_name_set.find(name) == reserved_name_set.end()) {
      reserved_name_set.insert(name);
    } else {
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME,
               strings::Substitute(
                   "Enum value \"$0\" is reserved multiple times.", name));
    }
  }

  for (int i = 0; i < result->value_count(); i++) {
    const EnumValueDescriptor* value = result->value(i);
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const EnumDescriptor::ReservedRange* range = result->reserved_range(j);
      if (range->start <= value->number() && value->number() <= range->end) {
        AddError(
            value->full_name(), proto.reserved_range(j),
            DescriptorPool::ErrorCollector::NUMBER,
            strings::Substitute("Enum value \"$0\" uses reserved number $1.",
                                value->name(), value->number()));
      }
    }
    if (reserved_name_set.find(value->name()) != reserved_name_set.end()) {
      AddError(
          value->full_name(), proto.value(i),
          DescriptorPool::ErrorCollector::NAME,
          strings::Substitute("Enum value \"$0\" is reserved.", value->name()));
    }
  }
}